

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

int mp_check(char **data,char *end)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  byte *pbVar4;
  bool bVar5;
  int iVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  mp_check_error err;
  byte local_61;
  mp_check_error local_60;
  
  pbVar4 = (byte *)*data;
  local_60.pos = (char *)pbVar4;
  lVar10 = 1;
  while (local_60.pos != end) {
    bVar1 = *local_60.pos;
    pbVar7 = (byte *)local_60.pos + 1;
    *data = (char *)pbVar7;
    bVar2 = ""[bVar1];
    uVar9 = (uint)(char)bVar2;
    if ((char)bVar2 < '\0') {
      if (bVar2 < 0xe1) {
        switch(bVar2) {
        case 0xd6:
          local_60.type = MP_CHECK_ERROR_ILL;
          goto LAB_0013c660;
        case 0xd7:
          if (4 < (ulong)((long)end - (long)pbVar7)) {
            uVar9 = *(uint *)((byte *)local_60.pos + 1);
            uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
            uVar8 = (ulong)uVar9;
            local_61 = ((byte *)local_60.pos)[5];
            pbVar7 = (byte *)local_60.pos + 6;
            *data = (char *)pbVar7;
            if (uVar8 <= (ulong)((long)end - (long)pbVar7)) {
              iVar6 = (*mp_check_ext_data)(local_61,(char *)pbVar7,uVar9);
              if (iVar6 == 0) {
                pbVar7 = (byte *)(*data + uVar8);
                *data = (char *)pbVar7;
                goto LAB_0013c3bc;
              }
LAB_0013c6b5:
              local_60.type = MP_CHECK_ERROR_EXT;
              local_60.pos = *data;
              local_60.ext_type = local_61;
              local_60.ext_len = (uint32_t)uVar8;
              goto LAB_0013c660;
            }
          }
          break;
        case 0xd8:
          if (2 < (ulong)((long)end - (long)pbVar7)) {
            uVar3 = *(ushort *)((byte *)local_60.pos + 1);
            local_61 = ((byte *)local_60.pos)[3];
            pbVar7 = (byte *)local_60.pos + 4;
            *data = (char *)pbVar7;
            uVar8 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
            if (uVar8 <= (ulong)((long)end - (long)pbVar7)) {
LAB_0013c50c:
              iVar6 = (*mp_check_ext_data)(local_61,(char *)pbVar7,(uint32_t)uVar8);
              if (iVar6 != 0) goto LAB_0013c6b5;
              pbVar7 = (byte *)(*data + uVar8);
              *data = (char *)pbVar7;
              goto LAB_0013c3bc;
            }
          }
          break;
        case 0xd9:
          if (1 < (ulong)((long)end - (long)pbVar7)) {
            uVar8 = (ulong)((byte *)local_60.pos)[1];
            local_61 = ((byte *)local_60.pos)[2];
            pbVar7 = (byte *)local_60.pos + 3;
            *data = (char *)pbVar7;
            if (uVar8 <= (ulong)((long)end - (long)pbVar7)) goto LAB_0013c50c;
          }
          break;
        case 0xda:
          if (3 < (ulong)((long)end - (long)pbVar7)) {
            uVar9 = *(uint *)((byte *)local_60.pos + 1);
            uVar8 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18);
            pbVar7 = (byte *)local_60.pos + 5;
            *data = (char *)pbVar7;
LAB_0013c575:
            lVar10 = lVar10 + uVar8 * 2;
            goto LAB_0013c3bc;
          }
          break;
        case 0xdb:
          if (1 < (ulong)((long)end - (long)pbVar7)) {
            uVar3 = *(ushort *)((byte *)local_60.pos + 1);
            pbVar7 = (byte *)local_60.pos + 3;
            *data = (char *)pbVar7;
            uVar8 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
            goto LAB_0013c575;
          }
          break;
        case 0xdc:
          if (3 < (ulong)((long)end - (long)pbVar7)) {
            uVar9 = *(uint *)((byte *)local_60.pos + 1);
            uVar8 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18);
            pbVar7 = (byte *)local_60.pos + 5;
            *data = (char *)pbVar7;
LAB_0013c5be:
            lVar10 = lVar10 + uVar8;
            goto LAB_0013c3bc;
          }
          break;
        case 0xdd:
          if (1 < (ulong)((long)end - (long)pbVar7)) {
            uVar3 = *(ushort *)((byte *)local_60.pos + 1);
            pbVar7 = (byte *)local_60.pos + 3;
            *data = (char *)pbVar7;
            uVar8 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
            goto LAB_0013c5be;
          }
          break;
        case 0xde:
          if (3 < (ulong)((long)end - (long)pbVar7)) {
            uVar9 = *(uint *)((byte *)local_60.pos + 1);
            uVar8 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                           uVar9 << 0x18);
            pbVar7 = (byte *)local_60.pos + 5;
LAB_0013c5d8:
            *data = (char *)pbVar7;
            if (uVar8 <= (ulong)((long)end - (long)pbVar7)) {
              pbVar7 = pbVar7 + uVar8;
              *data = (char *)pbVar7;
              goto LAB_0013c3bc;
            }
          }
          break;
        case 0xdf:
          if (1 < (ulong)((long)end - (long)pbVar7)) {
            uVar3 = *(ushort *)((byte *)local_60.pos + 1);
            pbVar7 = (byte *)local_60.pos + 3;
            *data = (char *)pbVar7;
            uVar8 = (ulong)(ushort)(uVar3 << 8 | uVar3 >> 8);
            if (uVar8 <= (ulong)((long)end - (long)pbVar7)) {
              pbVar7 = pbVar7 + uVar8;
              *data = (char *)pbVar7;
              goto LAB_0013c3bc;
            }
          }
          break;
        case 0xe0:
          if (pbVar7 != (byte *)end) {
            uVar8 = (ulong)((byte *)local_60.pos)[1];
            pbVar7 = (byte *)local_60.pos + 2;
            goto LAB_0013c5d8;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                        ,0xd31,"int mp_check(const char **, const char *)");
        }
        break;
      }
      lVar10 = lVar10 - (int)uVar9;
    }
    else {
      if ((ulong)((long)end - (long)pbVar7) < (ulong)uVar9) break;
      if ((byte)(bVar1 + 0x2c) < 5) {
        uVar9 = uVar9 - 1;
        bVar1 = ((byte *)local_60.pos)[1];
        *data = (char *)((byte *)local_60.pos + 2);
        iVar6 = (*mp_check_ext_data)(bVar1,(char *)((byte *)local_60.pos + 2),uVar9);
        if (iVar6 != 0) {
          local_60.type = MP_CHECK_ERROR_EXT;
          local_60.pos = *data;
          local_60.ext_type = bVar1;
          local_60.ext_len = uVar9;
          goto LAB_0013c660;
        }
        pbVar7 = (byte *)(*data + uVar9);
      }
      else {
        pbVar7 = pbVar7 + uVar9;
      }
      *data = (char *)pbVar7;
    }
LAB_0013c3bc:
    bVar5 = lVar10 < 2;
    local_60.pos = (char *)pbVar7;
    lVar10 = lVar10 + -1;
    if (bVar5) {
      if (pbVar7 <= end) {
        return 0;
      }
      __assert_fail("*data <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xd35,"int mp_check(const char **, const char *)");
    }
  }
  local_60.type = MP_CHECK_ERROR_TRUNC;
  local_60.trunc_count = lVar10;
LAB_0013c660:
  local_60.data = (char *)pbVar4;
  local_60.end = end;
  (*mp_check_on_error)(&local_60);
  return 1;
}

Assistant:

MP_IMPL int
mp_check(const char **data, const char *end)
{
	const char *begin = *data;

#define MP_CHECK_LEN(_l)						\
	if (mp_unlikely((size_t)(end - *data) < (size_t)(_l))) {	\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_TRUNC;			\
		err.data = begin;					\
		err.end = end;						\
		err.pos = pos;						\
		err.trunc_count = k;					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

#define MP_CHECK_EXT(_type, _data, _len)				\
	if (mp_check_ext_data((_type), (_data), (_len)) != 0) {		\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_EXT;				\
		err.data = begin;					\
		err.end = end;						\
		err.pos = (_data);					\
		err.ext_type = (_type);					\
		err.ext_len = (_len);					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

	int64_t k;
	for (k = 1; k > 0; k--) {
		const char *pos = *data;
		MP_CHECK_LEN(1);
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		uint32_t len;
		int8_t type;
		if (mp_likely(l >= 0)) {
			MP_CHECK_LEN(l);
			if (mp_unlikely(c >= 0xd4 && c <= 0xd8)) {
				/*
				 * Check MP_EXT contents. Everything but the
				 * first byte (which stands for ext type) is the
				 * payload.
				 */
				len = l - 1;
				type = mp_load_u8(data);
				MP_CHECK_EXT(type, *data, len);
				*data += len;
			} else {
				*data += l;
			}
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			MP_CHECK_LEN(sizeof(uint8_t));
			len = mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			len = mp_load_u16(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			MP_CHECK_LEN(sizeof(uint32_t))
			len = mp_load_u32(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += 2 * (uint32_t)mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += 2 * (uint64_t)mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			MP_CHECK_LEN(sizeof(uint8_t) + sizeof(uint8_t));
			len = mp_load_u8(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			MP_CHECK_LEN(sizeof(uint16_t) + sizeof(uint8_t));
			len = mp_load_u16(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			MP_CHECK_LEN(sizeof(uint32_t) + sizeof(uint8_t));
			len = mp_load_u32(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_INVALID:
		{
			struct mp_check_error err;
			err.type = MP_CHECK_ERROR_ILL;
			err.data = begin;
			err.end = end;
			err.pos = pos;
			mp_check_on_error(&err);
			return 1;
		}
		default:
			mp_unreachable();
		}
	}

	assert(*data <= end);
#undef MP_CHECK_LEN
#undef MP_CHECK_EXT
	return 0;
}